

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::Concatenate::dim_forward
          (Dim *__return_storage_ptr__,Concatenate *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  invalid_argument *this_00;
  ulong uVar6;
  ulong __n;
  uint uVar7;
  pointer pDVar8;
  uint uVar9;
  bool bVar10;
  Dim c;
  Dim r_1;
  Dim r;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint local_1f8;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_1e8;
  pointer local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  uint local_1a8;
  undefined8 local_1a4;
  uint local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  
  pDVar8 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = *(undefined8 *)pDVar8->d;
  uVar2 = *(undefined8 *)(pDVar8->d + 2);
  uVar3 = *(undefined8 *)(pDVar8->d + 6);
  *(undefined8 *)(__return_storage_ptr__->d + 4) = *(undefined8 *)(pDVar8->d + 4);
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar3;
  __return_storage_ptr__->bd = pDVar8->bd;
  *(undefined8 *)__return_storage_ptr__->d = uVar1;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
  if (1 < (ulong)__return_storage_ptr__->nd) {
    uVar6 = 1;
    do {
      if (__return_storage_ptr__->d[uVar6] != 1) goto LAB_00209d6c;
      uVar6 = uVar6 + 1;
    } while (__return_storage_ptr__->nd != uVar6);
  }
  __return_storage_ptr__->nd = 1;
LAB_00209d6c:
  local_1e8 = xs;
  local_1e0 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (pDVar8 != local_1e0) {
    uVar9 = __return_storage_ptr__->bd;
    uVar7 = 0;
    do {
      local_218 = *(undefined8 *)pDVar8->d;
      uStack_210 = *(undefined8 *)(pDVar8->d + 2);
      local_208 = *(undefined8 *)(pDVar8->d + 4);
      uStack_200 = *(ulong *)(pDVar8->d + 6);
      local_1f8 = pDVar8->bd;
      if (1 < uStack_200 >> 0x20) {
        uVar6 = 1;
        do {
          if (*(int *)((long)&local_218 + uVar6 * 4) != 1) goto LAB_00209dcf;
          uVar6 = uVar6 + 1;
        } while (uStack_200 >> 0x20 != uVar6);
      }
      uStack_200 = CONCAT44(1,(undefined4)uStack_200);
LAB_00209dcf:
      uVar4 = (uint)local_218;
      if ((uint)local_218 == 0) {
        __return_storage_ptr__->bd = uVar9;
        goto LAB_00209efe;
      }
      __return_storage_ptr__->d[0] = (uint)local_218;
      local_1a8 = __return_storage_ptr__->d[0];
      local_1a4 = *(undefined8 *)(__return_storage_ptr__->d + 1);
      local_19c = __return_storage_ptr__->d[3];
      local_198 = *(undefined8 *)(__return_storage_ptr__->d + 4);
      uVar1 = *(undefined8 *)(__return_storage_ptr__->d + 6);
      local_188 = 1;
      uStack_1c0 = uStack_200;
      uVar6 = uStack_1c0;
      local_1b8 = 1;
      uStack_190._4_4_ = (uint)((ulong)uVar1 >> 0x20);
      __n = (ulong)uStack_190._4_4_;
      uStack_1c0._4_4_ = (uint)(uStack_200 >> 0x20);
      bVar10 = uStack_190._4_4_ != uStack_1c0._4_4_;
      local_1d8 = local_218;
      uStack_1d0 = uStack_210;
      local_1c8 = local_208;
      uStack_1c0 = uVar6;
      uStack_190 = uVar1;
      if (bVar10) {
LAB_00209e82:
        __return_storage_ptr__->bd = uVar9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Bad input dimensions in Concatenate: ",0x25);
        operator<<((ostream *)&local_1a8,local_1e8);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,(string *)&local_1d8);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar5 = bcmp(&local_1a8,&local_1d8,__n);
      if (iVar5 != 0) goto LAB_00209e82;
      uVar7 = uVar7 + uVar4;
      if (uVar9 <= local_1f8) {
        uVar9 = local_1f8;
      }
      pDVar8 = pDVar8 + 1;
    } while (pDVar8 != local_1e0);
    __return_storage_ptr__->bd = uVar9;
    if (uVar7 != 0) {
      __return_storage_ptr__->d[0] = uVar7;
      return __return_storage_ptr__;
    }
  }
LAB_00209efe:
  __assert_fail("s > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/dim.h"
                ,0x44,"void cnn::Dim::set(unsigned int, unsigned int)");
}

Assistant:

Dim Concatenate::dim_forward(const vector<Dim>& xs) const {
  unsigned new_rows = 0;
  Dim dr = xs[0];
  if (LooksLikeVector(dr)) dr.resize(1);
  for (auto c : xs) {
    if (LooksLikeVector(c)) c.resize(1);
    new_rows += c[0];
    dr.set(0, c[0]);
    if (dr.single_batch() != c.single_batch()) {
      ostringstream s; s << "Bad input dimensions in Concatenate: " << xs;
      throw std::invalid_argument(s.str());
    }
    dr.bd = max(dr.bd, c.bd);
  }
  dr.set(0, new_rows);
  return dr;
}